

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O3

void __thiscall
QPDFParser::addScalar<QPDF_String,std::__cxx11::string_const&>
          (QPDFParser *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  StackFrame *pSVar1;
  QPDF *pQVar2;
  qpdf_offset_t qVar3;
  shared_ptr<QPDFObject> obj;
  undefined8 local_30;
  undefined8 local_28;
  
  if (((this->bad_count == 0) && (this->sanity_checks != true)) ||
     ((pSVar1 = this->frame,
      (ulong)((long)(pSVar1->olist).
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(pSVar1->olist).
                   super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                   super__Vector_impl_data._M_start) < 0x13881 &&
      ((pSVar1->dict)._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x1389)))) {
    QPDFObject::create<QPDF_String,std::__cxx11::string_const&>
              ((QPDFObject *)&stack0xffffffffffffffd0,args);
    pQVar2 = this->context;
    qVar3 = InputSource::getLastOffset(this->input);
    *(QPDF **)(local_30 + 0x48) = pQVar2;
    *(element_type **)(local_30 + 0x38) =
         (this->description).
         super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_30 + 0x40),
               &(this->description).
                super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    if (*(long *)(local_30 + 0x58) < 0) {
      *(qpdf_offset_t *)(local_30 + 0x58) = qVar3;
    }
    add(this,(shared_ptr<QPDFObject> *)&stack0xffffffffffffffd0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
    }
  }
  else {
    this->max_bad_count = 0;
  }
  return;
}

Assistant:

void
QPDFParser::addScalar(Args&&... args)
{
    if ((bad_count || sanity_checks) &&
        (frame->olist.size() > 5'000 || frame->dict.size() > 5'000)) {
        // Stop adding scalars. We are going to abort when the close token or a bad token is
        // encountered.
        max_bad_count = 0;
        return;
    }
    auto obj = QPDFObject::create<T>(std::forward<Args>(args)...);
    obj->setDescription(context, description, input.getLastOffset());
    add(std::move(obj));
}